

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O3

bool32 __thiscall rw::AnimInterpolator::setCurrentAnim(AnimInterpolator *this,Animation *anim)

{
  AnimInterpolatorInfo *pAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BlendCB p_Var5;
  int iVar6;
  bool32 bVar7;
  void *pvVar8;
  Animation *pAVar9;
  long lVar10;
  int iVar11;
  
  pAVar1 = anim->interpInfo;
  this->currentAnim = anim;
  this->currentTime = 0.0;
  if (this->maxInterpKeyFrameSize + 0x10 < pAVar1->interpKeyFrameSize) {
    setCurrentAnim();
    bVar7 = 0;
  }
  else {
    this->currentInterpKeyFrameSize = pAVar1->interpKeyFrameSize;
    iVar11 = pAVar1->animKeyFrameSize;
    this->currentAnimKeyFrameSize = iVar11;
    p_Var5 = pAVar1->blendCB;
    this->applyCB = pAVar1->applyCB;
    this->blendCB = p_Var5;
    uVar2 = *(undefined4 *)((long)&pAVar1->interpCB + 4);
    uVar3 = *(undefined4 *)&pAVar1->addCB;
    uVar4 = *(undefined4 *)((long)&pAVar1->addCB + 4);
    *(undefined4 *)&this->interpCB = *(undefined4 *)&pAVar1->interpCB;
    *(undefined4 *)((long)&this->interpCB + 4) = uVar2;
    *(undefined4 *)&this->addCB = uVar3;
    *(undefined4 *)((long)&this->addCB + 4) = uVar4;
    iVar6 = this->numNodes;
    if (0 < iVar6) {
      iVar11 = 0;
      do {
        lVar10 = (long)iVar11 * (long)this->currentInterpKeyFrameSize;
        pvVar8 = this->currentAnim->keyframes;
        pAVar9 = (Animation *)((long)(this->currentAnimKeyFrameSize * iVar11) + (long)pvVar8);
        pvVar8 = (void *)((long)((iVar6 + iVar11) * this->currentAnimKeyFrameSize) + (long)pvVar8);
        *(Animation **)((long)&this[1].currentAnim + lVar10) = pAVar9;
        *(void **)((long)&this[1].currentTime + lVar10) = pvVar8;
        if (this->interpCB != (InterpCB)0x0) {
          (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar10),pAVar9,pvVar8,0.0,
                            anim->customData);
          iVar6 = this->numNodes;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar6);
      anim = this->currentAnim;
      iVar11 = this->currentAnimKeyFrameSize;
    }
    this->nextFrame = (void *)((long)(iVar11 * iVar6 * 2) + (long)anim->keyframes);
    bVar7 = 1;
  }
  return bVar7;
}

Assistant:

bool32
AnimInterpolator::setCurrentAnim(Animation *anim)
{
	int32 i;
	AnimInterpolatorInfo *interpInfo = anim->interpInfo;
	this->currentAnim = anim;
	this->currentTime = 0.0f;
	int32 maxkf = this->maxInterpKeyFrameSize;
	if(sizeof(void*) > 4)	// see above in create()
		maxkf += 16;
	if(interpInfo->interpKeyFrameSize > maxkf){
		RWERROR((ERR_GENERAL, "interpolation frame too big"));
		return 0;
	}
	this->currentInterpKeyFrameSize = interpInfo->interpKeyFrameSize;
	this->currentAnimKeyFrameSize = interpInfo->animKeyFrameSize;
	this->applyCB = interpInfo->applyCB;
	this->blendCB = interpInfo->blendCB;
	this->interpCB = interpInfo->interpCB;
	this->addCB = interpInfo->addCB;
	for(i = 0; i < numNodes; i++){
		InterpFrameHeader *intf;
		KeyFrameHeader *kf1, *kf2;
		intf = this->getInterpFrame(i);
		kf1 = this->getAnimFrame(i);
		kf2 = this->getAnimFrame(i+numNodes);
		intf->keyFrame1 = kf1;
		intf->keyFrame2 = kf2;
		// TODO: perhaps just implement all interpolator infos?
		if(this->interpCB)
			this->interpCB(intf, kf1, kf2, 0.0f, anim->customData);
	}
	this->nextFrame = this->getAnimFrame(numNodes*2);
	return 1;
}